

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_port.h
# Opt level: O1

void __thiscall
sc_core::sc_port<sc_core::sc_signal_in_if<bool>,_1,_(sc_core::sc_port_policy)0>::sc_port
          (sc_port<sc_core::sc_signal_in_if<bool>,_1,_(sc_core::sc_port_policy)0> *this,
          base_type *parent_)

{
  socklen_t in_ECX;
  sockaddr *__addr;
  
  sc_port_base::sc_port_base((sc_port_base *)this,1,SC_ONE_OR_MORE_BOUND);
  (this->super_sc_port_b<sc_core::sc_signal_in_if<bool>_>).m_interface_vec.
  super__Vector_base<sc_core::sc_signal_in_if<bool>_*,_std::allocator<sc_core::sc_signal_in_if<bool>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_sc_port_b<sc_core::sc_signal_in_if<bool>_>).m_interface_vec.
  super__Vector_base<sc_core::sc_signal_in_if<bool>_*,_std::allocator<sc_core::sc_signal_in_if<bool>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_sc_port_b<sc_core::sc_signal_in_if<bool>_>).m_interface =
       (sc_signal_in_if<bool> *)0x0;
  (this->super_sc_port_b<sc_core::sc_signal_in_if<bool>_>).m_interface_vec.
  super__Vector_base<sc_core::sc_signal_in_if<bool>_*,_std::allocator<sc_core::sc_signal_in_if<bool>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_sc_port_b<sc_core::sc_signal_in_if<bool>_>).super_sc_port_base.super_sc_object.
  _vptr_sc_object = (_func_int **)&PTR_print_0026c628;
  sc_warn_port_constructor();
  sc_port_base::bind((sc_port_base *)this,(int)parent_,__addr,in_ECX);
  return;
}

Assistant:

explicit sc_port( base_type& parent_ )
	: base_type( N, P )
	{ sc_warn_port_constructor(); base_type::bind( parent_ ); }